

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  cmListFileContext *context;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MessageType messageType;
  allocator local_199;
  cmMakefile *local_198;
  cmMakefile *local_190;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  cmCommandContext local_120;
  cmListFileContext execContext;
  cmConditionEvaluator conditionEvaluator;
  
  iVar3 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"while");
  if (iVar3 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar3 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar3 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&conditionEvaluator,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (conditionEvaluator.Makefile == (cmMakefile *)0x0) {
          return false;
        }
        errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
        errorString._M_string_length = 0;
        errorString.field_2._M_local_buf[0] = '\0';
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_190 = conditionEvaluator.Makefile;
        cmMakefile::ExpandArguments(mf,&this->Args,&expandedArguments,(char *)0x0);
        context = &(this->super_cmFunctionBlocker).StartingContext;
        cmListFileContext::cmListFileContext(&execContext,context);
        local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
        local_120.Name._M_string_length = 0;
        local_120.Name.field_2._M_local_buf[0] = '\0';
        local_120.Line = execContext.Line;
        std::__cxx11::string::_M_assign((string *)&local_120);
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&err,mf,&local_120);
        cmConditionEvaluator::cmConditionEvaluator
                  (&conditionEvaluator,mf,context,(cmListFileBacktrace *)&err);
        local_198 = mf;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&err);
        bVar2 = cmConditionEvaluator::IsTrue
                          (&conditionEvaluator,&expandedArguments,&errorString,&messageType);
        do {
          if (bVar2 == false) {
LAB_00358eb4:
            cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
            std::__cxx11::string::~string((string *)&local_120);
            cmListFileContext::~cmListFileContext(&execContext);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&expandedArguments);
            std::__cxx11::string::~string((string *)&errorString);
            (*(code *)(local_190->FindPackageModuleStack).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map[3])();
            return true;
          }
          if (errorString._M_string_length != 0) {
            std::__cxx11::string::string((string *)&err,"had incorrect arguments: ",&local_199);
            for (uVar4 = 0;
                (ulong)uVar4 <
                (ulong)(((long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Args).
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar4 = uVar4 + 1)
            {
              std::__cxx11::string::append((char *)&err);
              std::__cxx11::string::append((string *)&err);
              std::__cxx11::string::append((char *)&err);
              std::__cxx11::string::append((char *)&err);
            }
            std::__cxx11::string::append((char *)&err);
            std::__cxx11::string::append((string *)&err);
            std::__cxx11::string::append((char *)&err);
            cmMakefile::IssueMessage(local_198,messageType,&err);
            if (messageType == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              std::__cxx11::string::~string((string *)&err);
              goto LAB_00358eb4;
            }
            std::__cxx11::string::~string((string *)&err);
          }
          uVar4 = 0;
          while( true ) {
            pcVar1 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 6) <=
                (ulong)uVar4) break;
            err._M_dataplus._M_p._0_4_ = 0;
            cmMakefile::ExecuteCommand(local_198,pcVar1 + uVar4,(cmExecutionStatus *)&err);
            if ((char)err._M_dataplus._M_p == '\x01') {
              inStatus->ReturnInvoked = true;
              goto LAB_00358eb4;
            }
            if (err._M_dataplus._M_p._1_1_ != '\0') goto LAB_00358eb4;
            if (err._M_dataplus._M_p._2_1_ != '\0') break;
            bVar2 = cmSystemTools::GetFatalErrorOccured();
            uVar4 = uVar4 + 1;
            if (bVar2) goto LAB_00358eb4;
          }
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::clear
                    (&expandedArguments);
          cmMakefile::ExpandArguments(local_198,&this->Args,&expandedArguments,(char *)0x0);
          bVar2 = cmConditionEvaluator::IsTrue
                            (&conditionEvaluator,&expandedArguments,&errorString,&messageType);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "while")) {
    // record the number of while commands past this one
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endwhile")) {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for (i = 0; i < this->Args.size(); ++i) {
            err += (this->Args[i].Delim ? "\"" : "");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (unsigned int c = 0; c < this->Functions.size(); ++c) {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}